

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8_t *target)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EpsCopyOutputStream out;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  iVar1 = *(int *)((long)&this->_vptr_MessageLite +
                  (ulong)*(uint *)(CONCAT44(extraout_var,iVar1) + 0x38));
  iVar2 = (*this->_vptr_MessageLite[5])(this,target);
  if (target + iVar1 == (uint8_t *)CONCAT44(extraout_var_00,iVar2)) {
    return (uint8_t *)CONCAT44(extraout_var_00,iVar2);
  }
  SerializeWithCachedSizesToArray();
}

Assistant:

uint8_t* MessageLite::SerializeWithCachedSizesToArray(uint8_t* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}